

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O0

xmlNodePtr
xmlXIncludeCopyXPointer
          (xmlXIncludeCtxtPtr ctxt,xmlDocPtr target,xmlDocPtr source,xmlXPathObjectPtr obj)

{
  xmlElementType xVar1;
  xmlNodeSetPtr pxVar2;
  int *piVar3;
  xmlNodePtr elem;
  xmlNodePtr pxVar4;
  xmlLocationSetPtr set_1;
  xmlNodePtr cur;
  xmlNodePtr tmp;
  xmlNodeSetPtr set;
  xmlNodePtr pxStack_40;
  int i;
  xmlNodePtr last;
  xmlNodePtr list;
  xmlXPathObjectPtr obj_local;
  xmlDocPtr source_local;
  xmlDocPtr target_local;
  xmlXIncludeCtxtPtr ctxt_local;
  
  last = (xmlNodePtr)0x0;
  pxStack_40 = (xmlNodePtr)0x0;
  obj_local = (xmlXPathObjectPtr)source;
  if (source == (xmlDocPtr)0x0) {
    obj_local = (xmlXPathObjectPtr)ctxt->doc;
  }
  if ((((ctxt == (xmlXIncludeCtxtPtr)0x0) || (target == (xmlDocPtr)0x0)) ||
      (obj_local == (xmlXPathObjectPtr)0x0)) || (obj == (xmlXPathObjectPtr)0x0)) {
    ctxt_local = (xmlXIncludeCtxtPtr)0x0;
  }
  else {
    switch(obj->type) {
    case XPATH_NODESET:
      pxVar2 = obj->nodesetval;
      if (pxVar2 == (xmlNodeSetPtr)0x0) {
        return (xmlNodePtr)0x0;
      }
      for (set._4_4_ = 0; set._4_4_ < pxVar2->nodeNr; set._4_4_ = set._4_4_ + 1) {
        if (pxVar2->nodeTab[set._4_4_] != (xmlNodePtr)0x0) {
          xVar1 = pxVar2->nodeTab[set._4_4_]->type;
          if (xVar1 == XML_ELEMENT_NODE) {
LAB_001e7917:
            if (pxStack_40 == (xmlNodePtr)0x0) {
              pxStack_40 = xmlXIncludeCopyNode(ctxt,target,(xmlDocPtr)obj_local,
                                               pxVar2->nodeTab[set._4_4_]);
              last = pxStack_40;
            }
            else {
              pxVar4 = xmlXIncludeCopyNode(ctxt,target,(xmlDocPtr)obj_local,
                                           pxVar2->nodeTab[set._4_4_]);
              xmlAddNextSibling(pxStack_40,pxVar4);
              if (pxStack_40->next != (_xmlNode *)0x0) {
                pxStack_40 = pxStack_40->next;
              }
            }
          }
          else if (xVar1 != XML_ATTRIBUTE_NODE) {
            if (xVar1 - XML_TEXT_NODE < 7) goto LAB_001e7917;
            if (2 < xVar1 - XML_DOCUMENT_TYPE_NODE) {
              if (xVar1 == XML_HTML_DOCUMENT_NODE) goto LAB_001e7917;
              if (4 < xVar1 - XML_DTD_NODE) {
                if (xVar1 != XML_XINCLUDE_START) goto LAB_001e7917;
                for (set_1 = (xmlLocationSetPtr)pxVar2->nodeTab[set._4_4_]->next;
                    (set_1 != (xmlLocationSetPtr)0x0 &&
                    ((*(int *)&set_1->locTab == 1 || (*(int *)&set_1->locTab - 3U < 6))));
                    set_1 = *(xmlLocationSetPtr *)(set_1 + 3)) {
                  elem = xmlXIncludeCopyNode(ctxt,target,(xmlDocPtr)obj_local,(xmlNodePtr)set_1);
                  pxVar4 = elem;
                  if (pxStack_40 != (xmlNodePtr)0x0) {
                    xmlAddNextSibling(pxStack_40,elem);
                    pxVar4 = last;
                  }
                  last = pxVar4;
                  pxStack_40 = elem;
                }
              }
            }
          }
        }
      }
      break;
    default:
      break;
    case XPATH_POINT:
      break;
    case XPATH_RANGE:
      pxVar4 = xmlXIncludeCopyRange(ctxt,target,(xmlDocPtr)obj_local,obj);
      return pxVar4;
    case XPATH_LOCATIONSET:
      piVar3 = (int *)obj->user;
      if (piVar3 == (int *)0x0) {
        return (xmlNodePtr)0x0;
      }
      for (set._4_4_ = 0; set._4_4_ < *piVar3; set._4_4_ = set._4_4_ + 1) {
        if (pxStack_40 == (xmlNodePtr)0x0) {
          pxStack_40 = xmlXIncludeCopyXPointer
                                 (ctxt,target,(xmlDocPtr)obj_local,
                                  *(xmlXPathObjectPtr *)
                                   (*(long *)(piVar3 + 2) + (long)set._4_4_ * 8));
          last = pxStack_40;
        }
        else {
          pxVar4 = xmlXIncludeCopyXPointer
                             (ctxt,target,(xmlDocPtr)obj_local,
                              *(xmlXPathObjectPtr *)(*(long *)(piVar3 + 2) + (long)set._4_4_ * 8));
          xmlAddNextSibling(pxStack_40,pxVar4);
        }
        if (pxStack_40 != (xmlNodePtr)0x0) {
          for (; pxStack_40->next != (_xmlNode *)0x0; pxStack_40 = pxStack_40->next) {
          }
        }
      }
    }
    ctxt_local = (xmlXIncludeCtxtPtr)last;
  }
  return (xmlNodePtr)ctxt_local;
}

Assistant:

static xmlNodePtr
xmlXIncludeCopyXPointer(xmlXIncludeCtxtPtr ctxt, xmlDocPtr target,
	                xmlDocPtr source, xmlXPathObjectPtr obj) {
    xmlNodePtr list = NULL, last = NULL;
    int i;

    if (source == NULL)
	source = ctxt->doc;
    if ((ctxt == NULL) || (target == NULL) || (source == NULL) ||
	(obj == NULL))
	return(NULL);
    switch (obj->type) {
        case XPATH_NODESET: {
	    xmlNodeSetPtr set = obj->nodesetval;
	    if (set == NULL)
		return(NULL);
	    for (i = 0;i < set->nodeNr;i++) {
		if (set->nodeTab[i] == NULL)
		    continue;
		switch (set->nodeTab[i]->type) {
		    case XML_TEXT_NODE:
		    case XML_CDATA_SECTION_NODE:
		    case XML_ELEMENT_NODE:
		    case XML_ENTITY_REF_NODE:
		    case XML_ENTITY_NODE:
		    case XML_PI_NODE:
		    case XML_COMMENT_NODE:
		    case XML_DOCUMENT_NODE:
		    case XML_HTML_DOCUMENT_NODE:
#ifdef LIBXML_DOCB_ENABLED
		    case XML_DOCB_DOCUMENT_NODE:
#endif
		    case XML_XINCLUDE_END:
			break;
		    case XML_XINCLUDE_START: {
	                xmlNodePtr tmp, cur = set->nodeTab[i];

			cur = cur->next;
			while (cur != NULL) {
			    switch(cur->type) {
				case XML_TEXT_NODE:
				case XML_CDATA_SECTION_NODE:
				case XML_ELEMENT_NODE:
				case XML_ENTITY_REF_NODE:
				case XML_ENTITY_NODE:
				case XML_PI_NODE:
				case XML_COMMENT_NODE:
				    tmp = xmlXIncludeCopyNode(ctxt, target,
							      source, cur);
				    if (last == NULL) {
					list = last = tmp;
				    } else {
					xmlAddNextSibling(last, tmp);
					last = tmp;
				    }
				    cur = cur->next;
				    continue;
				default:
				    break;
			    }
			    break;
			}
			continue;
		    }
		    case XML_ATTRIBUTE_NODE:
		    case XML_NAMESPACE_DECL:
		    case XML_DOCUMENT_TYPE_NODE:
		    case XML_DOCUMENT_FRAG_NODE:
		    case XML_NOTATION_NODE:
		    case XML_DTD_NODE:
		    case XML_ELEMENT_DECL:
		    case XML_ATTRIBUTE_DECL:
		    case XML_ENTITY_DECL:
			continue; /* for */
		}
		if (last == NULL)
		    list = last = xmlXIncludeCopyNode(ctxt, target, source,
			                              set->nodeTab[i]);
		else {
		    xmlAddNextSibling(last,
			    xmlXIncludeCopyNode(ctxt, target, source,
				                set->nodeTab[i]));
		    if (last->next != NULL)
			last = last->next;
		}
	    }
	    break;
	}
#ifdef LIBXML_XPTR_ENABLED
	case XPATH_LOCATIONSET: {
	    xmlLocationSetPtr set = (xmlLocationSetPtr) obj->user;
	    if (set == NULL)
		return(NULL);
	    for (i = 0;i < set->locNr;i++) {
		if (last == NULL)
		    list = last = xmlXIncludeCopyXPointer(ctxt, target, source,
			                                  set->locTab[i]);
		else
		    xmlAddNextSibling(last,
			    xmlXIncludeCopyXPointer(ctxt, target, source,
				                    set->locTab[i]));
		if (last != NULL) {
		    while (last->next != NULL)
			last = last->next;
		}
	    }
	    break;
	}
	case XPATH_RANGE:
	    return(xmlXIncludeCopyRange(ctxt, target, source, obj));
#endif
	case XPATH_POINT:
	    /* points are ignored in XInclude */
	    break;
	default:
	    break;
    }
    return(list);
}